

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

void __thiscall kj::AutoCloseFd::~AutoCloseFd(AutoCloseFd *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  Fault f;
  Runnable local_20;
  AutoCloseFd *local_18;
  
  if (-1 < this->fd) {
    bVar1 = UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar1) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_0044e518;
      local_18 = this;
      UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
    }
    else {
      iVar2 = close(this->fd);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        _::Debug::Fault::Fault<int,int&>
                  ((Fault *)&local_20,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x14c,*piVar3,"close","fd",&this->fd);
        _::Debug::Fault::~Fault((Fault *)&local_20);
      }
    }
  }
  return;
}

Assistant:

AutoCloseFd::~AutoCloseFd() noexcept(false) {
  if (fd >= 0) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Don't use SYSCALL() here because close() should not be repeated on EINTR.
      if (miniposix::close(fd) < 0) {
        KJ_FAIL_SYSCALL("close", errno, fd) {
          break;
        }
      }
    });
  }
}